

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O2

void __thiscall
QTriangulatingStroker::arcPoints
          (QTriangulatingStroker *this,float cx,float cy,float fromX,float fromY,float toX,float toY
          ,QVarLengthArray<float,_256LL> *points)

{
  long lVar1;
  double dVar2;
  long in_FS_OFFSET;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  fVar4 = fromY - cy;
  fVar5 = fromX - cx;
  fVar6 = toY - cy;
  fVar3 = -(toX - cx);
  while (fVar5 * fVar6 + fVar4 * fVar3 < 0.0) {
    dVar2 = (double)fVar4;
    fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + dVar2 * *(double *)(this + 0x48));
    fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + dVar2 * -*(double *)(this + 0x40));
    local_24 = fVar5 + cx;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
    local_24 = fVar4 + cy;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
  }
  while (fVar5 * (toX - cx) + fVar6 * fVar4 < 0.0) {
    dVar2 = (double)fVar4;
    fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + dVar2 * *(double *)(this + 0x48));
    fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + dVar2 * -*(double *)(this + 0x40));
    local_24 = fVar5 + cx;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
    local_24 = fVar4 + cy;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
  }
  while (0.0 < fVar5 * fVar6 + fVar4 * fVar3) {
    dVar2 = (double)fVar4;
    fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + dVar2 * *(double *)(this + 0x48));
    fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + dVar2 * -*(double *)(this + 0x40));
    local_24 = fVar5 + cx;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
    local_24 = fVar4 + cy;
    QVarLengthArray<float,_256LL>::emplace_back<float>(points,&local_24);
  }
  lVar1 = (points->super_QVLABase<float>).super_QVLABaseBase.s;
  if (lVar1 != 0) {
    QVarLengthArray<float,_256LL>::resize(points,lVar1 + -2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::arcPoints(float cx, float cy, float fromX, float fromY, float toX, float toY, QVarLengthArray<float> &points)
{
    float dx1 = fromX - cx;
    float dy1 = fromY - cy;
    float dx2 = toX - cx;
    float dy2 = toY - cy;

    // while more than 180 degrees left:
    while (dx1 * dy2 - dx2 * dy1 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 90 degrees left:
    while (dx1 * dx2 + dy1 * dy2 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 0 degrees left:
    while (dx1 * dy2 - dx2 * dy1 > 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // remove last point which was rotated beyond [toX, toY].
    if (!points.isEmpty())
        points.resize(points.size() - 2);
}